

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopl_file.c
# Opt level: O1

int WOPL_SaveBankToMem(WOPLFile *file,void *dest_mem,size_t length,uint16_t version,
                      uint16_t force_gm)

{
  WOPLBank *pWVar1;
  uint uVar2;
  undefined6 in_register_0000000a;
  long lVar3;
  long lVar4;
  long lVar5;
  ushort version_00;
  ulong uVar6;
  undefined2 in_register_00000082;
  ulong uVar7;
  uint8_t *cursor;
  bool bVar8;
  uint16_t bankslots_sizes [2];
  WOPLBank *bankslots [2];
  ushort local_64 [2];
  ulong local_60;
  WOPLBank *local_58 [2];
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_64[1] = 1;
  local_64[0] = 1;
  if (CONCAT22(in_register_00000082,force_gm) == 0) {
    local_64[0] = file->banks_count_melodic;
  }
  if (force_gm == 0) {
    local_64[1] = file->banks_count_percussion;
  }
  uVar6 = 3;
  if (version != 0) {
    uVar6 = CONCAT62(in_register_0000000a,version) & 0xffffffff;
  }
  if (10 < length) {
    *(undefined8 *)dest_mem = 0x41422d334c504f57;
    *(undefined4 *)((long)dest_mem + 7) = 0x4b4e41;
    if (1 < length - 0xb) {
      *(ushort *)((long)dest_mem + 0xb) = (ushort)uVar6;
      if (((1 < length - 0xd) &&
          (*(ushort *)((long)dest_mem + 0xd) = local_64[0] << 8 | local_64[0] >> 8, 1 < length - 0xf
          )) && (*(ushort *)((long)dest_mem + 0xf) = local_64[1] << 8 | local_64[1] >> 8,
                1 < length - 0x11)) {
        *(uint8_t *)((long)dest_mem + 0x11) = file->opl_flags;
        *(uint8_t *)((long)dest_mem + 0x12) = file->volume_model;
        cursor = (uint8_t *)((long)dest_mem + 0x13);
        uVar7 = length - 0x13;
        local_58[0] = file->banks_melodic;
        local_58[1] = file->banks_percussive;
        if (1 < (ushort)uVar6) {
          local_60 = CONCAT44(local_60._4_4_,(int)uVar6);
          lVar5 = 0;
          do {
            if (local_64[lVar5] != 0) {
              lVar3 = 0;
              uVar6 = 0;
              do {
                bVar8 = uVar7 < 0x22;
                uVar7 = uVar7 - 0x22;
                if (bVar8) {
                  return 2;
                }
                pWVar1 = local_58[lVar5];
                strncpy((char *)cursor,pWVar1->bank_name + lVar3,0x20);
                cursor[0x20] = pWVar1->ins[0].inst_name[lVar3 + -3];
                cursor[0x21] = local_58[lVar5]->ins[0].inst_name[lVar3 + -2];
                cursor = cursor + 0x22;
                uVar6 = uVar6 + 1;
                lVar3 = lVar3 + 0x2224;
              } while (uVar6 < local_64[lVar5]);
            }
            bVar8 = lVar5 == 0;
            uVar6 = local_60 & 0xffffffff;
            lVar5 = lVar5 + 1;
          } while (bVar8);
        }
        version_00 = (ushort)uVar6;
        uVar2 = (uint)(2 < version_00) * 0x200 + 0x1f00;
        local_40 = (ulong)uVar2;
        local_48 = (ulong)(ushort)uVar2;
        lVar5 = 0;
        while (local_64[lVar5] * local_48 <= uVar7) {
          if (local_64[lVar5] != 0) {
            lVar3 = 0;
            local_38 = 0;
            do {
              local_60 = uVar7;
              lVar4 = 0x24;
              do {
                WOPL_writeInstrument
                          ((WOPLInstrument *)(local_58[lVar5]->bank_name + lVar4 + lVar3),cursor,
                           version_00,'\x01');
                cursor = cursor + (ulong)(2 < version_00) * 4 + 0x3e;
                lVar4 = lVar4 + 0x44;
              } while (lVar4 != 0x2224);
              uVar7 = local_60 - local_40;
              local_38 = local_38 + 1;
              lVar3 = lVar3 + 0x2224;
            } while (local_38 < local_64[lVar5]);
          }
          bVar8 = lVar5 != 0;
          lVar5 = lVar5 + 1;
          if (bVar8) {
            return 0;
          }
        }
      }
    }
  }
  return 2;
}

Assistant:

int WOPL_SaveBankToMem(WOPLFile *file, void *dest_mem, size_t length, uint16_t version, uint16_t force_gm)
{
    uint8_t *cursor = (uint8_t *)dest_mem;
    uint16_t ins_size = 0;
    uint16_t i, j, k;
    uint16_t banks_melodic = force_gm ? 1 : file->banks_count_melodic;
    uint16_t banks_percusive = force_gm ? 1 : file->banks_count_percussion;

    WOPLBank *bankslots[2];
    uint16_t  bankslots_sizes[2];

    if(version == 0)
        version = wopl_latest_version;

#define GO_FORWARD(bytes) { cursor += bytes; length -= bytes; }

    if(length < 11)
        return WOPL_ERR_UNEXPECTED_ENDING;
    memcpy(cursor, wopl3_magic, 11);
    GO_FORWARD(11);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    fromUint16LE(version, cursor);
    GO_FORWARD(2);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    fromUint16BE(banks_melodic, cursor);
    GO_FORWARD(2);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    fromUint16BE(banks_percusive, cursor);
    GO_FORWARD(2);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    cursor[0] = file->opl_flags;
    cursor[1] = file->volume_model;
    GO_FORWARD(2);

    bankslots[0]        = file->banks_melodic;
    bankslots_sizes[0]  = banks_melodic;
    bankslots[1]        = file->banks_percussive;
    bankslots_sizes[1]  = banks_percusive;

    if(version >= 2)
    {
        for(i = 0; i < 2; i++)
        {
            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                if(length < 34)
                    return WOPL_ERR_UNEXPECTED_ENDING;
                strncpy((char*)cursor, bankslots[i][j].bank_name, 32);
                cursor[32] = bankslots[i][j].bank_midi_lsb;
                cursor[33] = bankslots[i][j].bank_midi_msb;
                GO_FORWARD(34);
            }
        }
    }

    {/* Write instruments data */
        if(version >= 3)
            ins_size = WOPL_INST_SIZE_V3;
        else
            ins_size = WOPL_INST_SIZE_V2;
        for(i = 0; i < 2; i++)
        {
            if(length < (ins_size * 128) * (size_t)bankslots_sizes[i])
                return WOPL_ERR_UNEXPECTED_ENDING;

            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                for(k = 0; k < 128; k++)
                {
                    WOPLInstrument *ins = &bankslots[i][j].ins[k];
                    WOPL_writeInstrument(ins, cursor, version, 1);
                    GO_FORWARD(ins_size);
                }
            }
        }
    }

    return WOPL_ERR_OK;
#undef GO_FORWARD
}